

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O1

void __thiscall spvtools::opt::UpgradeMemoryModel::UpgradeBarriers(UpgradeMemoryModel *this)

{
  Module *pMVar1;
  IRContext *pIVar2;
  TypeManager *this_00;
  ConstantManager *this_01;
  pointer pOVar3;
  Instruction *pIVar4;
  bool bVar5;
  uint32_t uVar6;
  array<signed_char,_4UL> aVar7;
  Instruction *pIVar8;
  Type *type;
  uint64_t uVar9;
  Constant *c;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  Instruction *pIVar13;
  undefined8 *puVar14;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> barriers;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  undefined1 local_108 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_e8;
  Instruction *local_e0;
  undefined8 *local_d8;
  undefined8 *puStack_d0;
  long local_c8;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  Instruction *local_98;
  undefined8 *local_90;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  
  local_b8._8_8_ = &local_d8;
  local_d8 = (undefined8 *)0x0;
  puStack_d0 = (undefined8 *)0x0;
  local_c8 = 0;
  pcStack_a0 = std::
               _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/upgrade_memory_model.cpp:623:37)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/upgrade_memory_model.cpp:623:37)>
             ::_M_manager;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_b8._M_unused._M_object = this;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_88,0);
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar13 = *(Instruction **)
             ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  pIVar8 = (Instruction *)
           ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  pIVar4 = pIVar8;
  if (pIVar13 != pIVar8) {
    do {
      local_98 = pIVar4;
      uVar6 = (pIVar13->has_result_id_ & 1) + 1;
      if (pIVar13->has_type_id_ == false) {
        uVar6 = (uint)pIVar13->has_result_id_;
      }
      local_e0 = pIVar13;
      uVar6 = Instruction::GetSingleWordOperand(pIVar13,uVar6);
      if (uVar6 == 1) {
        uVar12 = (local_e0->has_result_id_ & 1) + 1;
        if (local_e0->has_type_id_ == false) {
          uVar12 = (uint)local_e0->has_result_id_;
        }
        uVar6 = Instruction::GetSingleWordOperand(local_e0,uVar12 + 1);
        local_108._0_4_ = uVar6;
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,(uint *)local_108
                  );
        bVar5 = IRContext::ProcessCallTreeFromRoots
                          ((this->super_Pass).context_,(ProcessFunction *)&local_b8,
                           (queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&local_88);
        if ((bVar5) && (local_90 = puStack_d0, puVar14 = local_d8, local_d8 != puStack_d0)) {
          do {
            pIVar13 = (Instruction *)*puVar14;
            uVar12 = (pIVar13->has_result_id_ & 1) + 1;
            if (pIVar13->has_type_id_ == false) {
              uVar12 = (uint)pIVar13->has_result_id_;
            }
            uVar6 = Instruction::GetSingleWordOperand(pIVar13,uVar12 + 2);
            pIVar2 = (this->super_Pass).context_;
            if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar2);
            }
            pIVar8 = analysis::DefUseManager::GetDef
                               ((pIVar2->def_use_mgr_)._M_t.
                                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                ._M_head_impl,uVar6);
            pIVar2 = (this->super_Pass).context_;
            if ((pIVar2->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
              IRContext::BuildTypeManager(pIVar2);
            }
            this_00 = (pIVar2->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl;
            uVar6 = 0;
            if (pIVar8->has_type_id_ == true) {
              uVar6 = Instruction::GetSingleWordOperand(pIVar8,0);
            }
            type = analysis::TypeManager::GetType(this_00,uVar6);
            uVar9 = GetIndexValue(this,pIVar8);
            pIVar2 = (this->super_Pass).context_;
            if ((pIVar2->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
              IRContext::BuildConstantManager(pIVar2);
            }
            this_01 = (pIVar2->constant_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                      _M_head_impl;
            local_108._0_8_ = (_func_int **)0x0;
            local_108._8_8_ = (pointer)0x0;
            local_108._16_4_ = (array<signed_char,_4UL>)0x0;
            local_108._20_4_ = (array<signed_char,_4UL>)0x0;
            local_108._0_8_ = operator_new(4);
            local_108._8_8_ = local_108._0_8_ + 4;
            *(uint *)local_108._0_8_ = (uint)uVar9 | 0x1000;
            local_108._16_8_ = local_108._8_8_;
            c = analysis::ConstantManager::GetConstant
                          (this_01,type,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
            if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
              operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
            }
            pIVar2 = (this->super_Pass).context_;
            if ((pIVar2->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
              IRContext::BuildConstantManager(pIVar2);
            }
            aVar7._M_elems[0] = '\0';
            aVar7._M_elems[1] = '\0';
            aVar7._M_elems[2] = '\0';
            aVar7._M_elems[3] = '\0';
            pIVar8 = analysis::ConstantManager::GetDefiningInstruction
                               ((pIVar2->constant_mgr_)._M_t.
                                super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>
                                ._M_head_impl,c,0,(inst_iterator *)0x0);
            if (pIVar8->has_result_id_ == true) {
              aVar7._M_elems =
                   (_Type)Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
            }
            local_108._0_8_ = &PTR__SmallVector_003e9b28;
            local_108._24_8_ = local_108 + 0x10;
            local_e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_108._16_4_ = aVar7._M_elems;
            local_108._8_8_ = (pointer)0x1;
            uVar10 = (ulong)(pIVar13->has_result_id_ & 1) + 1;
            if (pIVar13->has_type_id_ == false) {
              uVar10 = (ulong)pIVar13->has_result_id_;
            }
            uVar10 = uVar10 + 2;
            pOVar3 = (pIVar13->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar11 = ((long)(pIVar13->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                     -0x5555555555555555;
            if (uVar11 < uVar10 || uVar11 - uVar10 == 0) {
              __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                            ,0x2b8,
                            "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                           );
            }
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      ((SmallVector<unsigned_int,_2UL> *)
                       ((long)((pOVar3->words).buffer + 0xfffffffffffffffc) +
                       (ulong)(uint)((int)uVar10 * 0x30)),
                       (SmallVector<unsigned_int,_2UL> *)local_108);
            local_108._0_8_ = &PTR__SmallVector_003e9b28;
            if (local_e8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_e8,local_e8._M_head_impl);
            }
            puVar14 = puVar14 + 1;
          } while (puVar14 != local_90);
        }
        pIVar8 = local_98;
        if (puStack_d0 != local_d8) {
          puStack_d0 = local_d8;
        }
      }
      pIVar13 = (local_e0->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      pIVar4 = local_98;
    } while (pIVar13 != pIVar8);
  }
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_88);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_d8 != (undefined8 *)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  return;
}

Assistant:

void UpgradeMemoryModel::UpgradeBarriers() {
  std::vector<Instruction*> barriers;
  // Collects all the control barriers in |function|. Returns true if the
  // function operates on the Output storage class.
  ProcessFunction CollectBarriers = [this, &barriers](Function* function) {
    bool operates_on_output = false;
    for (auto& block : *function) {
      block.ForEachInst([this, &barriers,
                         &operates_on_output](Instruction* inst) {
        if (inst->opcode() == spv::Op::OpControlBarrier) {
          barriers.push_back(inst);
        } else if (!operates_on_output) {
          // This instruction operates on output storage class if it is a
          // pointer to output type or any input operand is a pointer to output
          // type.
          analysis::Type* type =
              context()->get_type_mgr()->GetType(inst->type_id());
          if (type && type->AsPointer() &&
              type->AsPointer()->storage_class() == spv::StorageClass::Output) {
            operates_on_output = true;
            return;
          }
          inst->ForEachInId([this, &operates_on_output](uint32_t* id_ptr) {
            Instruction* op_inst =
                context()->get_def_use_mgr()->GetDef(*id_ptr);
            analysis::Type* op_type =
                context()->get_type_mgr()->GetType(op_inst->type_id());
            if (op_type && op_type->AsPointer() &&
                op_type->AsPointer()->storage_class() ==
                    spv::StorageClass::Output)
              operates_on_output = true;
          });
        }
      });
    }
    return operates_on_output;
  };

  std::queue<uint32_t> roots;
  for (auto& e : get_module()->entry_points())
    if (spv::ExecutionModel(e.GetSingleWordInOperand(0u)) ==
        spv::ExecutionModel::TessellationControl) {
      roots.push(e.GetSingleWordInOperand(1u));
      if (context()->ProcessCallTreeFromRoots(CollectBarriers, &roots)) {
        for (auto barrier : barriers) {
          // Add OutputMemoryKHR to the semantics of the barriers.
          uint32_t semantics_id = barrier->GetSingleWordInOperand(2u);
          Instruction* semantics_inst =
              context()->get_def_use_mgr()->GetDef(semantics_id);
          analysis::Type* semantics_type =
              context()->get_type_mgr()->GetType(semantics_inst->type_id());
          uint64_t semantics_value = GetIndexValue(semantics_inst);
          const analysis::Constant* constant =
              context()->get_constant_mgr()->GetConstant(
                  semantics_type,
                  {static_cast<uint32_t>(semantics_value) |
                   uint32_t(spv::MemorySemanticsMask::OutputMemoryKHR)});
          barrier->SetInOperand(2u, {context()
                                         ->get_constant_mgr()
                                         ->GetDefiningInstruction(constant)
                                         ->result_id()});
        }
      }
      barriers.clear();
    }
}